

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::GetOffset
          (BamStandardIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  BaiReferenceSummary *refSummary;
  int64_t *position;
  pointer pBVar1;
  long lVar2;
  pointer plVar3;
  int64_t *piVar4;
  bool bVar5;
  int iVar6;
  BamException *pBVar7;
  pointer plVar8;
  ulong uVar9;
  int64_t *piVar10;
  BamStandardIndex *this_00;
  ulong uVar11;
  difference_type __d;
  uint32_t begin;
  vector<long,_std::allocator<long>_> offsets;
  uint32_t end;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> candidateBins;
  string message;
  string readerError;
  BamAlignment al;
  uint32_t local_264;
  BamRegion *local_260;
  vector<long,_std::allocator<long>_> local_258;
  int64_t *local_238;
  bool *local_230;
  uint32_t local_224;
  undefined1 local_220 [32];
  _Base_ptr local_200;
  size_t local_1f8;
  string local_1f0;
  uint64_t local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  BamAlignment local_188;
  
  uVar11 = (ulong)region->LeftRefID;
  local_260 = region;
  local_230 = hasAlignmentsInRegion;
  if (-1 < (long)uVar11) {
    pBVar1 = (this->m_indexFileSummary).
             super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->m_indexFileSummary).
                   super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
            -0x5555555555555555;
    if (region->LeftRefID < (int)uVar9) {
      if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      this_00 = this;
      AdjustRegion(this,region,&local_264,&local_224);
      local_220._24_8_ = local_220 + 8;
      local_220._8_4_ = _S_red;
      local_220._16_8_ = (_Base_ptr)0x0;
      local_1f8 = 0;
      local_200 = (_Base_ptr)local_220._24_8_;
      CalculateCandidateBins
                (this_00,&local_264,&local_224,
                 (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 local_220);
      refSummary = pBVar1 + uVar11;
      local_1d0 = CalculateMinOffset(this,refSummary,&local_264);
      local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (int64_t *)0x0;
      local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int64_t *)0x0;
      local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      CalculateCandidateOffsets
                (this,refSummary,&local_1d0,
                 (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 local_220,&local_258);
      plVar3 = local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      plVar8 = local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar11 = (long)local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        lVar2 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (plVar8,plVar3);
        local_238 = offset;
        BamAlignment::BamAlignment(&local_188);
        uVar11 = (long)local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        plVar8 = local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (long)uVar11) {
          piVar10 = local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar9 = uVar11 >> 1;
            position = piVar10 + uVar9;
            bVar5 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,position);
            if (!bVar5) {
              BamReaderPrivate::GetErrorString_abi_cxx11_
                        (&local_1a8,(this->super_BamIndex).m_reader);
              std::operator+(&local_1c8,"could not seek in BAM file: \n\t",&local_1a8);
              pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f0,"BamToolsIndex::GetOffset","");
              BamException::BamException(pBVar7,&local_1f0,&local_1c8);
              __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
            }
            bVar5 = BamReaderPrivate::LoadNextAlignment((this->super_BamIndex).m_reader,&local_188);
            *local_230 = bVar5;
            iVar6 = BamAlignment::GetEndPosition(&local_188,false,false);
            uVar11 = uVar11 + ~uVar9;
            piVar4 = position + 1;
            if (local_260->LeftPosition < iVar6) {
              uVar11 = uVar9;
              piVar4 = piVar10;
            }
            piVar10 = piVar4;
          } while (0 < (long)uVar11);
          plVar8 = position + 1;
          if (local_260->LeftPosition < iVar6) {
            plVar8 = position;
          }
        }
        *local_238 = plVar8[(ulong)(plVar8 ==
                                   local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start) - 1];
        BamAlignment::~BamAlignment(&local_188);
      }
      if (local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (int64_t *)0x0) {
        operator_delete(local_258.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                   *)local_220);
      return;
    }
  }
  pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
  local_188.Name._M_dataplus._M_p = (pointer)&local_188.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"BamStandardIndex::GetOffset","");
  local_220._0_8_ = local_220 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"invalid reference ID requested","");
  BamException::BamException(pBVar7,&local_188.Name,(string *)local_220);
  __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion) {

    // cannot calculate offsets if unknown/invalid reference ID requested
    if ( region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size() )
        throw BamException("BamStandardIndex::GetOffset", "invalid reference ID requested");

    // retrieve index summary for left bound reference
    const BaiReferenceSummary& refSummary = m_indexFileSummary.at(region.LeftRefID);

    // set up region boundaries based on actual BamReader data
    uint32_t begin;
    uint32_t end;
    AdjustRegion(region, begin, end);

    // retrieve all candidate bin IDs for region
    set<uint16_t> candidateBins;
    CalculateCandidateBins(begin, end, candidateBins);

    // use reference's linear offsets to calculate the minimum offset
    // that must be considered to find overlap
    const uint64_t& minOffset = CalculateMinOffset(refSummary, begin);

    // attempt to use reference summary, minOffset, & candidateBins to calculate offsets
    // no data should not be error, just bail
    vector<int64_t> offsets;
    CalculateCandidateOffsets(refSummary, minOffset, candidateBins, offsets);
    if ( offsets.empty() )
        return;
    
    // ensure that offsets are sorted before processing
    sort( offsets.begin(), offsets.end() );

    // binary search for an overlapping block (may not be first one though)
    BamAlignment al;
    typedef vector<int64_t>::const_iterator OffsetConstIterator;
    OffsetConstIterator offsetFirst = offsets.begin();
    OffsetConstIterator offsetIter  = offsetFirst;
    OffsetConstIterator offsetLast  = offsets.end();
    iterator_traits<OffsetConstIterator>::difference_type count = distance(offsetFirst, offsetLast);
    iterator_traits<OffsetConstIterator>::difference_type step;
    while ( count > 0 ) {
        offsetIter = offsetFirst;
        step = count/2;
        advance(offsetIter, step);

        // attempt seek to candidate offset
        const int64_t& candidateOffset = (*offsetIter);
        if ( !m_reader->Seek(candidateOffset) ) {
            const string readerError = m_reader->GetErrorString();
            const string message = "could not seek in BAM file: \n\t" + readerError;
            throw BamException("BamToolsIndex::GetOffset", message);
        }

        // load first available alignment, setting flag to true if data exists
        *hasAlignmentsInRegion = m_reader->LoadNextAlignment(al);

        // check alignment against region
        if ( al.GetEndPosition() <= region.LeftPosition ) {
            offsetFirst = ++offsetIter;
            count -= step+1;
        } else count = step;
    }

    // step back to the offset before the 'current offset' (to make sure we cover overlaps)
    if ( offsetIter != offsets.begin() )
        --offsetIter;
    offset = (*offsetIter);
}